

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper
          (QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QNetworkRequestFactoryPrivate *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *in_RDI;
  void *in_R8;
  QNetworkRequestFactoryPrivate *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x329f4b);
  Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::operator->
            ((totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*> *)0x329f55);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x329f5d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::get(&in_RDI->d),
     this_00 != (QNetworkRequestFactoryPrivate *)0x0)) {
    QNetworkRequestFactoryPrivate::~QNetworkRequestFactoryPrivate(this_00);
    operator_delete(this_00,0x88);
  }
  Qt::totally_ordered_wrapper<QNetworkRequestFactoryPrivate_*>::reset
            (&in_RDI->d,(QNetworkRequestFactoryPrivate *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}